

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sjio.cpp
# Opt level: O2

void EmitWords(int *words,bool isInstructionStart)

{
  for (; *words != -1; words = words + 1) {
    EmitWord(*words,(bool)(isInstructionStart & 1));
    isInstructionStart = false;
  }
  return;
}

Assistant:

void EmitWords(const int* words, bool isInstructionStart) {
	while (BYTES_END_MARKER != *words) {
		EmitWord(*words++, isInstructionStart);
		isInstructionStart = false;		// only true for first word
	}
}